

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra.h
# Opt level: O2

int Extra_TruthIsEqual(uint *pIn0,uint *pIn1,int nVars)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar3 = 1;
  }
  do {
    if ((int)uVar3 < 1) {
      return 1;
    }
    lVar1 = uVar3 - 1;
    lVar2 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (pIn0[lVar1] == pIn1[lVar2]);
  return 0;
}

Assistant:

static inline int Extra_TruthIsEqual( unsigned * pIn0, unsigned * pIn1, int nVars )
{
    int w;
    for ( w = Extra_TruthWordNum(nVars)-1; w >= 0; w-- )
        if ( pIn0[w] != pIn1[w] )
            return 0;
    return 1;
}